

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O1

void __thiscall
wasm::SuffixTree::RepeatedSubstringIterator::advance(RepeatedSubstringIterator *this)

{
  pointer *pppSVar1;
  SuffixTreeInternalNode *this_00;
  SuffixTreeInternalNode *pSVar2;
  iterator __position;
  SuffixTreeLeafNode *this_01;
  iterator __position_00;
  pointer puVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  pointer ppSVar7;
  char *__function;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  iterator __begin2;
  _Hash_node_base *p_Var8;
  undefined1 auVar9 [8];
  undefined1 auStack_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> RepeatedSubstringStarts;
  SuffixTreeInternalNode *local_38;
  SuffixTreeInternalNode *InternalChild;
  
  RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RS).Length = 0;
  this_02 = &(this->RS).StartIndices;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (this_02,&RepeatedSubstringStarts);
  if (RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(RepeatedSubstringStarts.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)RepeatedSubstringStarts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)RepeatedSubstringStarts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  this->N = (SuffixTreeNode *)0x0;
  RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ppSVar7 = (this->InternalNodesToVisit).
            super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->InternalNodesToVisit).
      super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != ppSVar7) {
    do {
      if ((undefined1  [8])
          RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != auStack_58) {
        RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_58;
      }
      this_00 = ppSVar7[-1];
      (this->InternalNodesToVisit).
      super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppSVar7 + -1;
      uVar5 = SuffixTreeNode::getConcatLen(&this_00->super_SuffixTreeNode);
      for (p_Var8 = (this_00->Children)._M_h._M_before_begin._M_nxt;
          p_Var8 != (_Hash_node_base *)0x0; p_Var8 = p_Var8->_M_nxt) {
        pSVar2 = (SuffixTreeInternalNode *)p_Var8[2]._M_nxt;
        if (pSVar2 == (SuffixTreeInternalNode *)0x0) {
          __function = 
          "static bool llvm::isa_impl_cl<wasm::SuffixTreeInternalNode, const wasm::SuffixTreeNode *>::doit(const From *) [To = wasm::SuffixTreeInternalNode, From = const wasm::SuffixTreeNode *]"
          ;
LAB_00c36211:
          __assert_fail("Val && \"isa<> used on a null pointer\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                        ,0x69,__function);
        }
        local_38 = pSVar2;
        if ((pSVar2->super_SuffixTreeNode).Kind != ST_Internal) {
          local_38 = (SuffixTreeInternalNode *)0x0;
        }
        if (local_38 == (SuffixTreeInternalNode *)0x0) {
          if (this->MinLength <= uVar5) {
            this_01 = (SuffixTreeLeafNode *)p_Var8[2]._M_nxt;
            if (this_01 == (SuffixTreeLeafNode *)0x0) {
              __function = 
              "static bool llvm::isa_impl_cl<wasm::SuffixTreeLeafNode, const wasm::SuffixTreeNode *>::doit(const From *) [To = wasm::SuffixTreeLeafNode, From = const wasm::SuffixTreeNode *]"
              ;
              goto LAB_00c36211;
            }
            if ((this_01->super_SuffixTreeNode).Kind != ST_Leaf) {
              __assert_fail("isa<X>(Val) && \"cast<Ty>() argument of incompatible type!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                            ,0x108,
                            "typename cast_retty<X, Y *>::ret_type llvm::cast(Y *) [X = wasm::SuffixTreeLeafNode, Y = wasm::SuffixTreeNode]"
                           );
            }
            uVar6 = SuffixTreeLeafNode::getSuffixIdx(this_01);
            local_38 = (SuffixTreeInternalNode *)CONCAT44(local_38._4_4_,uVar6);
            if (RepeatedSubstringStarts.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                RepeatedSubstringStarts.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,
                         (iterator)
                         RepeatedSubstringStarts.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,(uint *)&local_38);
            }
            else {
              *RepeatedSubstringStarts.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = uVar6;
              RepeatedSubstringStarts.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   RepeatedSubstringStarts.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
          }
        }
        else {
          __position._M_current =
               (this->InternalNodesToVisit).
               super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->InternalNodesToVisit).
              super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::SuffixTreeInternalNode*,std::allocator<wasm::SuffixTreeInternalNode*>>
            ::_M_realloc_insert<wasm::SuffixTreeInternalNode*const&>
                      ((vector<wasm::SuffixTreeInternalNode*,std::allocator<wasm::SuffixTreeInternalNode*>>
                        *)&this->InternalNodesToVisit,__position,&local_38);
          }
          else {
            *__position._M_current = local_38;
            pppSVar1 = &(this->InternalNodesToVisit).
                        super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppSVar1 = *pppSVar1 + 1;
          }
        }
      }
      bVar4 = SuffixTreeInternalNode::isRoot(this_00);
      puVar3 = RepeatedSubstringStarts.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((!bVar4) &&
         (4 < (ulong)((long)RepeatedSubstringStarts.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)auStack_58))) {
        this->N = &this_00->super_SuffixTreeNode;
        (this->RS).Length = uVar5;
        if (auStack_58 !=
            (undefined1  [8])
            RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          auVar9 = auStack_58;
          do {
            local_38 = (SuffixTreeInternalNode *)CONCAT44(local_38._4_4_,*(uint *)auVar9);
            __position_00._M_current =
                 (this->RS).StartIndices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position_00._M_current ==
                (this->RS).StartIndices.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_02,__position_00,
                         (uint *)&local_38);
            }
            else {
              *__position_00._M_current = *(uint *)auVar9;
              (this->RS).StartIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position_00._M_current + 1;
            }
            auVar9 = (undefined1  [8])((long)auVar9 + 4);
          } while (auVar9 != (undefined1  [8])puVar3);
        }
        break;
      }
      ppSVar7 = (this->InternalNodesToVisit).
                super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->InternalNodesToVisit).
             super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start != ppSVar7);
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)RepeatedSubstringStarts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return;
}

Assistant:

void SuffixTree::RepeatedSubstringIterator::advance() {
  // Clear the current state. If we're at the end of the range, then this
  // is the state we want to be in.
  RS = RepeatedSubstring();
  N = nullptr;

  // Each leaf node represents a repeat of a string.
  std::vector<unsigned> RepeatedSubstringStarts;

  // Continue visiting nodes until we find one which repeats more than once.
  while (!InternalNodesToVisit.empty()) {
    RepeatedSubstringStarts.clear();
    auto* Curr = InternalNodesToVisit.back();
    InternalNodesToVisit.pop_back();

    // Keep track of the length of the string associated with the node. If
    // it's too short, we'll quit.
    unsigned Length = Curr->getConcatLen();

    // Iterate over each child, saving internal nodes for visiting, and
    // leaf nodes in LeafChildren. Internal nodes represent individual
    // strings, which may repeat.
    for (auto& ChildPair : Curr->Children) {
      // Save all of this node's children for processing.
      if (auto* InternalChild =
            dyn_cast<SuffixTreeInternalNode>(ChildPair.second)) {
        InternalNodesToVisit.push_back(InternalChild);
        continue;
      }

      if (Length < MinLength) {
        continue;
      }

      // Have an occurrence of a potentially repeated string. Save it.
      auto* Leaf = cast<SuffixTreeLeafNode>(ChildPair.second);
      RepeatedSubstringStarts.push_back(Leaf->getSuffixIdx());
    }

    // The root never represents a repeated substring. If we're looking at
    // that, then skip it.
    if (Curr->isRoot()) {
      continue;
    }

    // Do we have any repeated substrings?
    if (RepeatedSubstringStarts.size() < 2) {
      continue;
    }

    // Yes. Update the state to reflect this, and then bail out.
    N = Curr;
    RS.Length = Length;
    for (unsigned StartIdx : RepeatedSubstringStarts) {
      RS.StartIndices.push_back(StartIdx);
    }
    break;
  }
  // At this point, either NewRS is an empty RepeatedSubstring, or it was
  // set in the above loop. Similarly, N is either nullptr, or the node
  // associated with NewRS.
}